

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-from-text.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonValBuilder::_handleVal<long_long_const&>
          (JsonValBuilder *this,TextLocation *loc,longlong *args)

{
  pointer p_Var1;
  TextLocation loc_00;
  _Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false> _Var2;
  Up jsonVal;
  __uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
  in_stack_ffffffffffffffa0;
  _Alloc_hider in_stack_ffffffffffffffa8;
  Index in_stack_ffffffffffffffb0;
  TextLocation local_30;
  
  TextLocation::TextLocation
            (&local_30,this->_baseOffset + loc->_offset,loc->_lineNumber,loc->_colNumber);
  loc_00._lineNumber = (Index)in_stack_ffffffffffffffa8._M_p;
  loc_00._offset =
       (Index)in_stack_ffffffffffffffa0._M_t.
              super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
              .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl;
  loc_00._colNumber = in_stack_ffffffffffffffb0;
  createJsonVal(local_30._offset,loc_00);
  p_Var1 = (this->_stack).
           super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->_stack).
      super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
      ._M_impl.super__Vector_impl_data._M_start == p_Var1) {
    _Var2._M_head_impl =
         (this->_jsonVal)._M_t.
         super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
         .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl;
    (this->_jsonVal)._M_t.
    super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
    .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl =
         (JsonVal *)
         in_stack_ffffffffffffffa0._M_t.
         super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
         .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl;
  }
  else {
    if (p_Var1[-1].state == InObj) {
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffa8,(string *)&p_Var1[-1].lastObjKey);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>
      ::
      _M_emplace_unique<std::pair<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonScalarVal<long_long,(yactfr::internal::JsonValKind)2>const,std::default_delete<yactfr::internal::JsonScalarVal<long_long,(yactfr::internal::JsonValKind)2>const>>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>
                  *)&p_Var1[-1].objValCont,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>_>
                  *)&stack0xffffffffffffffa8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>_>
               *)&stack0xffffffffffffffa8);
      goto LAB_0027bb44;
    }
    if (p_Var1[-1].state != InArray) {
      abort();
    }
    _Var2._M_head_impl =
         (JsonVal *)
         in_stack_ffffffffffffffa0._M_t.
         super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
         .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::allocator<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>
    ::
    emplace_back<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>
              ((vector<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::allocator<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>
                *)&p_Var1[-1].arrayValCont,
               (unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                *)&stack0xffffffffffffffa8);
  }
  if ((tuple<const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
       )_Var2._M_head_impl != (_Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_JsonVal + 8))();
  }
LAB_0027bb44:
  std::
  unique_ptr<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>
  ::~unique_ptr((unique_ptr<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>,_std::default_delete<const_yactfr::internal::JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>_>_>
                 *)&stack0xffffffffffffffa0);
  return;
}

Assistant:

void _handleVal(const TextLocation& loc, ArgTs&&... args)
    {
        auto jsonVal = createJsonVal(std::forward<ArgTs>(args)..., TextLocation {
            loc.offset() + _baseOffset, loc.lineNumber(), loc.columnNumber()
        });

        if (_stack.empty()) {
            _jsonVal = std::move(jsonVal);
            return;
        }

        switch (_stack.back().state) {
        case _tState::InArray:
            this->_stackTop().arrayValCont.push_back(std::move(jsonVal));
            break;

        case _tState::InObj:
             // safe to move `lastObjKey`: only used once
            this->_stackTop().objValCont.insert(std::make_pair(std::move(this->_stackTop().lastObjKey),
                                                               std::move(jsonVal)));
            break;

        default:
            std::abort();
        }
    }